

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerProduct.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeInnnerProduct(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  Type *pTVar10;
  Type *pTVar11;
  undefined8 *puVar12;
  long *plVar13;
  Type *pTVar14;
  LayerUnion LVar15;
  LogMessage *pLVar16;
  Rep *pRVar17;
  WeightParams *pWVar18;
  uint uVar19;
  size_type *psVar20;
  unsigned_long uVar21;
  ulong *puVar22;
  uint64 uVar23;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  uint64 uVar31;
  char cVar32;
  undefined8 uVar33;
  uint uVar34;
  void **ppvVar35;
  InnerProductParameter *pIVar36;
  pointer pcVar37;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  uint *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string __str_4;
  string __str_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top_flatten;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_1b8;
  undefined1 local_198 [56];
  string local_160;
  uint64 local_140;
  Type *local_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  LayerUnion local_f0;
  Type *local_e8;
  ulong local_e0;
  string local_d8;
  long *local_b8;
  uint local_b0;
  long local_a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ulong local_38;
  
  uVar27 = *in_stack_00000048;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),uVar27);
  iVar9 = getLayerIndex(pTVar10,in_stack_00000030);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar9);
  if (((pTVar10->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar9 = 1, (pTVar10->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_198,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    iVar9 = (pTVar10->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar17 = (pTVar10->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar35 = pRVar17->elements;
  if (pRVar17 == (Rep *)0x0) {
    ppvVar35 = (void **)0x0;
  }
  local_138 = pTVar10;
  local_e8 = pTVar11;
  if (iVar9 != 0) {
    lVar29 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar35 + lVar29));
      lVar29 = lVar29 + 8;
    } while ((long)iVar9 * 8 != lVar29);
  }
  pRVar17 = (local_138->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar35 = pRVar17->elements;
  if (pRVar17 == (Rep *)0x0) {
    ppvVar35 = (void **)0x0;
  }
  lVar29 = (long)(local_138->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar29 != 0) {
    lVar30 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar35 + lVar30));
      lVar30 = lVar30 + 8;
    } while (lVar29 * 8 != lVar30);
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  pcVar37 = ((local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar37,
             pcVar37 + (local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  std::__cxx11::string::append((char *)&local_160);
  uVar28 = -uVar27;
  if (0 < (int)uVar27) {
    uVar28 = uVar27;
  }
  uVar34 = 1;
  if (9 < uVar28) {
    uVar24 = (ulong)uVar28;
    uVar7 = 4;
    do {
      uVar34 = uVar7;
      uVar19 = (uint)uVar24;
      if (uVar19 < 100) {
        uVar34 = uVar34 - 2;
        goto LAB_003d5b87;
      }
      if (uVar19 < 1000) {
        uVar34 = uVar34 - 1;
        goto LAB_003d5b87;
      }
      if (uVar19 < 10000) goto LAB_003d5b87;
      uVar24 = uVar24 / 10000;
      uVar7 = uVar34 + 4;
    } while (99999 < uVar19);
    uVar34 = uVar34 + 1;
  }
LAB_003d5b87:
  local_130 = &local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar34 - (char)((int)uVar27 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_130),uVar34,uVar28);
  uVar33 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    uVar33 = local_160.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < local_128 + local_160._M_string_length) {
    uVar24 = 0xf;
    if (local_130 != &local_120) {
      uVar24 = local_120;
    }
    if (uVar24 < local_128 + local_160._M_string_length) goto LAB_003d5c18;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_130,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
  }
  else {
LAB_003d5c18:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_130);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  psVar20 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_1b8.field_2._M_allocated_capacity = *psVar20;
    local_1b8.field_2._8_8_ = puVar12[3];
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar20;
    local_1b8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_1b8._M_string_length = puVar12[1];
  *puVar12 = psVar20;
  puVar12[1] = 0;
  *(undefined1 *)psVar20 = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_198._0_8_ = local_198 + 0x10;
  psVar20 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar20) {
    local_198._16_8_ = *psVar20;
    local_198._24_8_ = plVar13[3];
  }
  else {
    local_198._16_8_ = *psVar20;
    local_198._0_8_ = (size_type *)*plVar13;
  }
  local_198._8_8_ = plVar13[1];
  *plVar13 = (long)psVar20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  psVar4 = (local_138->name_).ptr_;
  local_198._0_8_ = local_198 + 0x10;
  pcVar37 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar37,pcVar37 + psVar4->_M_string_length);
  std::__cxx11::string::append(local_198);
  convertCaffeMetadata
            ((string *)local_198,&local_78,&local_98,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if (pTVar14->_oneof_case_[0] == 0x12d) {
    LVar15 = pTVar14->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar14);
    pTVar14->_oneof_case_[0] = 0x12d;
    LVar15.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CoreML::Specification::FlattenLayerParams::FlattenLayerParams(LVar15.flatten_);
    (pTVar14->layer_).flatten_ = (FlattenLayerParams *)LVar15;
  }
  ((LVar15.convolution_)->kernelsize_).current_size_ = 0;
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  pTVar10 = local_e8;
  convertCaffeMetadata
            ((local_138->name_).ptr_,&local_98,&local_58,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  if (pTVar14->_oneof_case_[0] == 0x8c) {
    local_f0 = pTVar14->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar14);
    pTVar14->_oneof_case_[0] = 0x8c;
    LVar15.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar15.innerproduct_);
    (pTVar14->layer_).innerproduct_ = (InnerProductLayerParams *)LVar15;
    local_f0.convolution_ = LVar15.convolution_;
  }
  pcVar37 = local_198 + 0x10;
  pIVar36 = local_138->inner_product_param_;
  if (pIVar36 == (InnerProductParameter *)0x0) {
    pIVar36 = (InnerProductParameter *)&caffe::_InnerProductParameter_default_instance_;
  }
  iVar9 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar9 == 0) {
    local_198._0_8_ = pcVar37;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Weight blobs not provided","");
    psVar4 = (local_138->name_).ptr_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Innerproduct","");
    errorInCaffeProto((string *)local_198,psVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_198._0_8_ != pcVar37) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    iVar9 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_;
  }
  if (iVar9 < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar16 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
  }
  pRVar17 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_;
  puVar12 = *(undefined8 **)((long)pRVar17->elements[0] + 0x78);
  puVar25 = puVar12;
  if (puVar12 == (undefined8 *)0x0) {
    puVar25 = &caffe::_BlobShape_default_instance_;
  }
  iVar9 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (*(int *)(puVar25 + 3) == 0) {
    if (iVar9 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar16 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
      pRVar17 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_;
      iVar9 = *(int *)((long)pRVar17->elements[0] + 0x88);
      if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar16 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
        pRVar17 = (pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_;
      }
    }
    else {
      iVar9 = *(int *)((long)pRVar17->elements[0] + 0x88);
    }
    local_140 = (uint64)iVar9;
    uVar31 = (uint64)*(int *)((long)pRVar17->elements[0] + 0x8c);
  }
  else {
    if (iVar9 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar16 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
      puVar12 = *(undefined8 **)
                 ((long)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    }
    if (puVar12 == (undefined8 *)0x0) {
      puVar12 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar12 + 3) < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar16 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
    }
    local_140 = *(uint64 *)(puVar12[4] + 8);
    if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar16 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
    }
    puVar12 = *(undefined8 **)
               ((long)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar12 == (undefined8 *)0x0) {
      puVar12 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar12 + 3) < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_198,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar16 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
    }
    uVar31 = *(uint64 *)(puVar12[4] + 0x10);
  }
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    local_e0 = 0;
  }
  else {
    local_e0 = (ulong)*(int *)(*(long *)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) +
                              0x18);
  }
  uVar24 = (ulong)pIVar36->num_output_;
  bVar2 = pIVar36->bias_term_;
  if (pIVar36->transpose_ == true) {
    local_198._0_8_ = pcVar37;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"transpose","");
    psVar4 = (local_138->name_).ptr_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Inner Product","");
    unsupportedCaffeParrameter((string *)local_198,psVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_198._0_8_ != pcVar37) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  if (pIVar36->axis_ != 1) {
    local_198._0_8_ = pcVar37;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"axis","");
    psVar4 = (local_138->name_).ptr_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    local_38 = uVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Inner Product","");
    uVar27 = pIVar36->axis_;
    uVar28 = -uVar27;
    if (0 < (int)uVar27) {
      uVar28 = uVar27;
    }
    uVar34 = 1;
    if (9 < uVar28) {
      uVar24 = (ulong)uVar28;
      uVar7 = 4;
      do {
        uVar34 = uVar7;
        uVar19 = (uint)uVar24;
        if (uVar19 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_003d63d5;
        }
        if (uVar19 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_003d63d5;
        }
        if (uVar19 < 10000) goto LAB_003d63d5;
        uVar24 = uVar24 / 10000;
        uVar7 = uVar34 + 4;
      } while (99999 < uVar19);
      uVar34 = uVar34 + 1;
    }
LAB_003d63d5:
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_160,(char)uVar34 - (char)((int)uVar27 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_160._M_dataplus._M_p + (uVar27 >> 0x1f),uVar34,uVar28);
    unsupportedCaffeParrameterWithOption((string *)local_198,psVar4,&local_1b8,&local_160);
    uVar24 = local_38;
    pTVar10 = local_e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  LVar15 = local_f0;
  bVar6 = (long)local_e0 < 1;
  if (bVar2 != false) {
    bVar6 = local_e0 != 0;
  }
  if (!bVar6) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"\'bias_term\' flag and blob size for bias incompatible","");
    psVar4 = (local_138->name_).ptr_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Inner Product","");
    errorInCaffeProto((string *)local_198,psVar4,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  if ((long)local_140 < 0) {
    __assert_fail("outputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x5f,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  if (local_140 != uVar24) {
    cVar32 = '\x01';
    if (9 < (uint)uVar24) {
      uVar21 = uVar24;
      cVar8 = '\x04';
      do {
        cVar32 = cVar8;
        if (uVar21 < 100) {
          cVar32 = cVar32 + -2;
          goto LAB_003d65b1;
        }
        if (uVar21 < 1000) {
          cVar32 = cVar32 + -1;
          goto LAB_003d65b1;
        }
        if (uVar21 < 10000) goto LAB_003d65b1;
        bVar6 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        cVar8 = cVar32 + '\x04';
      } while (bVar6);
      cVar32 = cVar32 + '\x01';
    }
LAB_003d65b1:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar32);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,uVar24);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e4ff8);
    local_130 = &local_120;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar22) {
      local_120 = *puVar22;
      lStack_118 = plVar13[3];
    }
    else {
      local_120 = *puVar22;
      local_130 = (ulong *)*plVar13;
    }
    local_128 = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160.field_2._8_8_ = plVar13[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_160._M_string_length = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar27 = 1;
    if (9 < local_140) {
      uVar23 = local_140;
      uVar28 = 4;
      do {
        uVar27 = uVar28;
        if (uVar23 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_003d670c;
        }
        if (uVar23 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_003d670c;
        }
        if (uVar23 < 10000) goto LAB_003d670c;
        bVar6 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        uVar28 = uVar27 + 4;
      } while (bVar6);
      uVar27 = uVar27 + 1;
    }
LAB_003d670c:
    local_110 = local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar27);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_110,uVar27,local_140);
    uVar33 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar33 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar33 < local_108 + local_160._M_string_length) {
      uVar24 = 0xf;
      if (local_110 != local_100) {
        uVar24 = local_100[0];
      }
      if (uVar24 < local_108 + local_160._M_string_length) goto LAB_003d6791;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_110,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_003d6791:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_110);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar20 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8.field_2._8_8_ = puVar12[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_1b8._M_string_length = puVar12[1];
    *puVar12 = psVar20;
    puVar12[1] = 0;
    *(undefined1 *)psVar20 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    local_198._0_8_ = local_198 + 0x10;
    psVar20 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar20) {
      local_198._16_8_ = *psVar20;
      local_198._24_8_ = plVar13[3];
    }
    else {
      local_198._16_8_ = *psVar20;
      local_198._0_8_ = (size_type *)*plVar13;
    }
    local_198._8_8_ = plVar13[1];
    *plVar13 = (long)psVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    psVar4 = (local_138->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
    errorInCaffeProto((string *)local_198,psVar4,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    LVar15 = local_f0;
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
      LVar15 = local_f0;
    }
  }
  if ((long)uVar31 < 0) {
    __assert_fail("inputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x66,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  (LVar15.innerproduct_)->inputchannels_ = uVar31;
  (LVar15.innerproduct_)->outputchannels_ = local_140;
  (LVar15.innerproduct_)->hasbias_ = bVar2;
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar16 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
  }
  uVar24 = uVar31 * local_140;
  uVar27 = *(uint *)((long)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  if (uVar24 - (long)(int)uVar27 != 0) {
    uVar28 = 1;
    if (9 < uVar24) {
      uVar26 = uVar24;
      uVar34 = 4;
      do {
        uVar28 = uVar34;
        if (uVar26 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003d6a57;
        }
        if (uVar26 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003d6a57;
        }
        if (uVar26 < 10000) goto LAB_003d6a57;
        bVar6 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        uVar34 = uVar28 + 4;
      } while (bVar6);
      uVar28 = uVar28 + 1;
    }
LAB_003d6a57:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar28);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,uVar28,uVar24);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e4537);
    local_130 = &local_120;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar22) {
      local_120 = *puVar22;
      lStack_118 = plVar13[3];
    }
    else {
      local_120 = *puVar22;
      local_130 = (ulong *)*plVar13;
    }
    local_128 = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160.field_2._8_8_ = plVar13[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_160._M_string_length = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar28 = -uVar27;
    if (0 < (int)uVar27) {
      uVar28 = uVar27;
    }
    uVar34 = 1;
    if (9 < uVar28) {
      uVar26 = (ulong)uVar28;
      uVar7 = 4;
      do {
        uVar34 = uVar7;
        uVar19 = (uint)uVar26;
        if (uVar19 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_003d6bb1;
        }
        if (uVar19 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_003d6bb1;
        }
        if (uVar19 < 10000) goto LAB_003d6bb1;
        uVar26 = uVar26 / 10000;
        uVar7 = uVar34 + 4;
      } while (99999 < uVar19);
      uVar34 = uVar34 + 1;
    }
LAB_003d6bb1:
    local_110 = local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar34 - (char)((int)uVar27 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_110 + (ulong)(uVar27 >> 0x1f)),uVar34,uVar28);
    uVar33 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar33 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar33 < local_108 + local_160._M_string_length) {
      uVar26 = 0xf;
      if (local_110 != local_100) {
        uVar26 = local_100[0];
      }
      if (uVar26 < local_108 + local_160._M_string_length) goto LAB_003d6c3f;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_110,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_003d6c3f:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_110);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar20 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8.field_2._8_8_ = puVar12[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_1b8._M_string_length = puVar12[1];
    *puVar12 = psVar20;
    puVar12[1] = 0;
    *(undefined1 *)psVar20 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar20 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar20) {
      local_198._16_8_ = *psVar20;
      local_198._24_8_ = plVar13[3];
      local_198._0_8_ = local_198 + 0x10;
    }
    else {
      local_198._16_8_ = *psVar20;
      local_198._0_8_ = (size_type *)*plVar13;
    }
    local_198._8_8_ = plVar13[1];
    *plVar13 = (long)psVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    psVar4 = (local_138->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
    errorInCaffeProto((string *)local_198,psVar4,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    LVar15 = local_f0;
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  pWVar18 = (WeightParams *)((LVar15.activation_)->NonlinearityType_).relu_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    ((LVar15.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar18;
  }
  if (0x7fffffff < (long)uVar24) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x75,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar18->floatvalue_;
  iVar9 = (int)uVar24;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar3 = pRVar1->current_size_;
    if (iVar3 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar3,0,(long)iVar9 * 4 + (long)iVar3 * -4);
    }
  }
  pRVar1->current_size_ = iVar9;
  if ((local_e8->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar16 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
  }
  pvVar5 = ((local_e8->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar5 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar9 = *(int *)((long)pvVar5 + 0x18);
    if (iVar9 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
      memcpy(((pWVar18->floatvalue_).rep_)->elements + (pWVar18->floatvalue_).current_size_,
             (void *)(*(long *)((long)pvVar5 + 0x20) + 8),(long)*(int *)((long)pvVar5 + 0x18) << 2);
      (pWVar18->floatvalue_).current_size_ =
           (pWVar18->floatvalue_).current_size_ + *(int *)((long)pvVar5 + 0x18);
    }
  }
  if (bVar2 == false) goto LAB_003d74bc;
  pTVar10 = local_e8;
  if (local_e0 != local_140) {
    uVar27 = 1;
    if (9 < local_140) {
      uVar31 = local_140;
      uVar28 = 4;
      do {
        uVar27 = uVar28;
        if (uVar31 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_003d6fba;
        }
        if (uVar31 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_003d6fba;
        }
        if (uVar31 < 10000) goto LAB_003d6fba;
        bVar2 = 99999 < uVar31;
        uVar31 = uVar31 / 10000;
        uVar28 = uVar27 + 4;
      } while (bVar2);
      uVar27 = uVar27 + 1;
    }
LAB_003d6fba:
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar27);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,uVar27,local_140);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e4537);
    uVar24 = local_e0;
    local_130 = &local_120;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar22) {
      local_120 = *puVar22;
      lStack_118 = plVar13[3];
    }
    else {
      local_120 = *puVar22;
      local_130 = (ulong *)*plVar13;
    }
    local_128 = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    puVar22 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar22) {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160.field_2._8_8_ = plVar13[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar22;
      local_160._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_160._M_string_length = plVar13[1];
    *plVar13 = (long)puVar22;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar26 = -uVar24;
    if (0 < (long)uVar24) {
      uVar26 = uVar24;
    }
    uVar27 = 1;
    if (9 < uVar26) {
      uVar24 = uVar26;
      uVar28 = 4;
      do {
        uVar27 = uVar28;
        if (uVar24 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_003d712a;
        }
        if (uVar24 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_003d712a;
        }
        if (uVar24 < 10000) goto LAB_003d712a;
        bVar2 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        uVar28 = uVar27 + 4;
      } while (bVar2);
      uVar27 = uVar27 + 1;
    }
LAB_003d712a:
    lVar29 = (long)local_e0 >> 0x3f;
    local_110 = local_100;
    std::__cxx11::string::_M_construct
              ((ulong)&local_110,(char)uVar27 - (char)((long)local_e0 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_110 - lVar29),uVar27,uVar26);
    uVar33 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar33 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar33 < local_108 + local_160._M_string_length) {
      uVar24 = 0xf;
      if (local_110 != local_100) {
        uVar24 = local_100[0];
      }
      if (uVar24 < local_108 + local_160._M_string_length) goto LAB_003d71bc;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_110,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_003d71bc:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_110);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar20 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8.field_2._8_8_ = puVar12[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar20;
      local_1b8._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_1b8._M_string_length = puVar12[1];
    *puVar12 = psVar20;
    puVar12[1] = 0;
    *(undefined1 *)psVar20 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    local_198._0_8_ = local_198 + 0x10;
    psVar20 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar20) {
      local_198._16_8_ = *psVar20;
      local_198._24_8_ = plVar13[3];
    }
    else {
      local_198._16_8_ = *psVar20;
      local_198._0_8_ = (size_type *)*plVar13;
    }
    local_198._8_8_ = plVar13[1];
    *plVar13 = (long)psVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    psVar4 = (local_138->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
    errorInCaffeProto((string *)local_198,psVar4,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    LVar15 = local_f0;
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    pTVar10 = local_e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  pWVar18 = (LVar15.innerproduct_)->bias_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    (local_f0.innerproduct_)->bias_ = pWVar18;
  }
  if (0x7fffffff < (long)local_140) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x81,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar18->floatvalue_;
  iVar9 = (int)local_140;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar3 = pRVar1->current_size_;
    if (iVar3 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar3,0,(long)iVar9 * 4 + (long)iVar3 * -4);
    }
  }
  pRVar1->current_size_ = iVar9;
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_198,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar16 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_198,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,pLVar16);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_198);
  }
  lVar29 = *(long *)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar29 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar9 = *(int *)(lVar29 + 0x18);
    if (iVar9 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
      memcpy(((pWVar18->floatvalue_).rep_)->elements + (pWVar18->floatvalue_).current_size_,
             (void *)(*(long *)(lVar29 + 0x20) + 8),(long)*(int *)(lVar29 + 0x18) << 2);
      (pWVar18->floatvalue_).current_size_ =
           (pWVar18->floatvalue_).current_size_ + *(int *)(lVar29 + 0x18);
    }
  }
LAB_003d74bc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    
    //We add two layers for the inner product layer: flatten + innerproduct
    std::vector<std::string> top_flatten;
    top_flatten.push_back(bottom[0] + "_" + std::to_string(layerId) + "_flattened");
    auto* nnWrite = layerParameters.nnWrite;
    
    //first write flatten
    Specification::NeuralNetworkLayer* specLayer_flatten = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_preflatten",
                                         bottom, top_flatten, nnWrite, mappingDataBlobNames);
    
    Specification::FlattenLayerParams* flatten_params = specLayer_flatten->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
    
    //now write inner product
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         top_flatten, top, nnWrite, mappingDataBlobNames);
    
    Specification::InnerProductLayerParams* specLayerParams = specLayer->mutable_innerproduct();
    const caffe::InnerProductParameter& caffeLayerParams = caffeLayer.inner_product_param();
    int64_t inputChannels = 0;
    int64_t outputChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto(
            "Weight blobs not provided", caffeLayer.name(), "Innerproduct");
    }
    
    // Sometimes caffe models do not populate the shape (infering from other parameters)
    if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
        outputChannels = caffeLayerWeights.blobs(0).height();
        inputChannels = caffeLayerWeights.blobs(0).width();
    } else {
        outputChannels = caffeLayerWeights.blobs(0).shape().dim(0);
        inputChannels = caffeLayerWeights.blobs(0).shape().dim(1);
    }

    uint64_t numOutput = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int64_t caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.transpose() == true) {
        CoreMLConverter::unsupportedCaffeParrameter("transpose",caffeLayer.name(), "Inner Product");
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis", caffeLayer.name(), "Inner Product",
                                  std::to_string(caffeLayerParams.axis()));
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), "Inner Product");
    }
    assert(outputChannels >= 0);
    if (static_cast<uint64_t>(outputChannels) != numOutput) {
        CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(numOutput)+") does not match the first dimension of the weight matrix ("+std::to_string(outputChannels)+")"
                                          ,caffeLayer.name(), "Inner Product");
    }
    //**************************************************************
    
    assert(inputChannels >= 0);
    specLayerParams->set_inputchannels(static_cast<uint64_t>(inputChannels));

    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights
    int64_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int32_t>(blobSize), 0.0);
    weightsWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    
    // Write bias 
    if (hasBias) {
        if (caffeBiasLength != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int32_t>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}